

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

void cfd::TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  ConfidentialTransaction *this;
  bool bVar1;
  undefined8 uVar2;
  reference this_00;
  byte in_CL;
  undefined8 in_RDX;
  OutPoint *in_RSI;
  ConfidentialTransaction *in_RDI;
  byte in_R8B;
  SignParameter *sign_param_2;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3_3;
  ScriptElement *element;
  iterator __end3_2;
  iterator __begin3_2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range3_2;
  ScriptBuilder builder;
  Script script;
  SignParameter *sign_param_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3_1;
  uint32_t txin_index;
  uint32_t vout;
  Txid txid;
  ScriptOperator op_code;
  SignParameter *sign_param;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range3;
  bool has_op_code;
  AbstractTxInReference *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  uint32_t uVar3;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  CfdError in_stack_fffffffffffffb4c;
  CfdException *in_stack_fffffffffffffb50;
  ScriptOperator *this_01;
  Script local_470;
  ByteData local_438;
  SignParameter *in_stack_fffffffffffffbe8;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_3e0;
  undefined8 local_3d8;
  reference local_3d0;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_3c8;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_3c0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_3b8;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_3a0;
  ScriptBuilder local_398;
  ConfidentialTxInReference local_378;
  Script local_218;
  Script local_1e0;
  ByteData local_1a8;
  ScriptWitness local_190;
  reference local_170;
  SignParameter *local_168;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_160;
  undefined8 local_158;
  uint32_t local_150;
  uint32_t local_14c;
  Txid local_148;
  ScriptOperator local_128;
  reference local_f8;
  SignParameter *local_f0;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_e8;
  undefined8 local_e0;
  byte local_d3;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  undefined1 local_55;
  allocator local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  undefined8 local_18;
  OutPoint *local_10;
  ConfidentialTransaction *local_8;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  if (in_RDI == (ConfidentialTransaction *)0x0) {
    local_55 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Empty transaction.",&local_41);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_55 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::empty
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  if (bVar1) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_transaction_internal.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0xfc;
    local_70.funcname = "AddSign";
    core::logger::warn<>(&local_70,"Failed to AddSign. Empty sign_params.");
    local_92 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Empty sign_params.",&local_91);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_92 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = core::OutPoint::IsValid(local_10);
  if (!bVar1) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_transaction_internal.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0x101;
    local_b0.funcname = "AddSign";
    core::logger::warn<>(&local_b0,"Failed to AddSign. Invalid outpoint.");
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid outpoint.",&local_d1);
    core::CfdException::CfdException
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (string *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_d2 = 0;
    __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_d3 = 0;
  if ((local_19 & 1) == 0) {
    local_e0 = local_18;
    local_e8._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    local_f0 = (SignParameter *)
               std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                         ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                          in_stack_fffffffffffffb28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)in_stack_fffffffffffffb28), bVar1) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                 ::operator*(&local_e8);
      bVar1 = SignParameter::IsOpCode(local_f8);
      if (bVar1) {
        this_01 = &local_128;
        SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffb28);
        bVar1 = core::ScriptOperator::IsPushOperator(this_01);
        if (bVar1) {
          local_d3 = 1;
        }
        core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x63838d);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_e8);
    }
  }
  core::OutPoint::GetTxid(&local_148,local_10);
  local_14c = core::OutPoint::GetVout(local_10);
  local_150 = (*(local_8->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                        (local_8,&local_148,(ulong)local_14c);
  if ((local_19 & 1) == 0) {
    core::Script::Script(&local_1e0);
    if ((local_1a & 1) == 0) {
      core::ConfidentialTransaction::GetTxIn(&local_378,local_8,local_150);
      core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffb28);
      core::Script::operator=(&local_1e0,&local_218);
      core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))
      ;
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)
                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    }
    core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x638657);
    core::Script::GetElementList(&local_3b8,&local_1e0);
    local_3a0 = &local_3b8;
    local_3c0._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                   (local_3a0);
    local_3c8._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                   (local_3a0);
    while (bVar1 = __gnu_cxx::operator!=(&local_3c0,&local_3c8), bVar1) {
      local_3d0 = __gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&local_3c0);
      core::ScriptBuilder::AppendElement(&local_398,local_3d0);
      __gnu_cxx::
      __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
      ::operator++(&local_3c0);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_3d8 = local_18;
    local_3e0._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffffb28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)in_stack_fffffffffffffb28), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                ::operator*(&local_3e0);
      if ((local_d3 & 1) == 0) {
LAB_0063884c:
        SignParameter::ConvertToSignature(in_stack_fffffffffffffbe8);
        core::ScriptBuilder::AppendData(&local_398,&local_438);
        core::ByteData::~ByteData((ByteData *)0x638887);
      }
      else {
        bVar1 = SignParameter::IsOpCode(this_00);
        in_stack_fffffffffffffb34 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb34);
        if (!bVar1) goto LAB_0063884c;
        SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffb28);
        core::ScriptBuilder::AppendOperator(&local_398,(ScriptOperator *)&stack0xfffffffffffffbe0);
        core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x638821);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_3e0);
    }
    uVar3 = local_150;
    core::ScriptBuilder::Build(&local_470,&local_398);
    core::ConfidentialTransaction::SetUnlockingScript(local_8,uVar3,&local_470);
    core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,uVar3));
    core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x638919);
    core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffb34,uVar3));
  }
  else {
    if ((local_1a & 1) != 0) {
      core::ConfidentialTransaction::RemoveScriptWitnessStackAll(local_8,local_150);
    }
    local_158 = local_18;
    local_160._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb28);
    local_168 = (SignParameter *)
                std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                          ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                           in_stack_fffffffffffffb28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                               *)in_stack_fffffffffffffb28), bVar1) {
      local_170 = __gnu_cxx::
                  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                  ::operator*(&local_160);
      this = local_8;
      uVar3 = local_150;
      SignParameter::ConvertToSignature(in_stack_fffffffffffffbe8);
      core::ConfidentialTransaction::AddScriptWitnessStack(&local_190,this,uVar3,&local_1a8);
      core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x638519);
      core::ByteData::~ByteData((ByteData *)0x638526);
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_160);
    }
  }
  core::Txid::~Txid((Txid *)0x63896f);
  return;
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}